

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall IteratorTest::constructorTest<true>(IteratorTest *this)

{
  int iVar1;
  reference piVar2;
  reference piVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var4;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar5;
  logic_error *plVar6;
  code *pcVar7;
  undefined *puVar8;
  long lVar9;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_1;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it;
  int scalar;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_f8;
  undefined1 local_c8 [8];
  pointer piStack_c0;
  size_t *local_b8;
  pointer puStack_b0;
  pointer local_a8;
  pointer puStack_a0;
  size_t local_98;
  CoordinateOrder local_90;
  bool local_8c;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_88;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_58;
  
  local_a8 = (pointer)0x0;
  puStack_a0 = (pointer)0x0;
  local_b8 = (size_t *)0x0;
  puStack_b0 = (pointer)0x0;
  local_c8 = (undefined1  [8])0x0;
  piStack_c0 = (pointer)0x0;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
  if (local_b8 != (size_t *)0x0) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test failed.");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (puStack_b0 != (pointer)0x0) {
    operator_delete(puStack_b0,(long)puStack_a0 - (long)puStack_b0);
  }
  local_58.view_._0_4_ = 0x2a;
  local_c8 = (undefined1  [8])&local_58;
  local_b8 = (size_t *)operator_new(0);
  puStack_a0 = (pointer)0x0;
  local_98 = 1;
  local_90 = LastMajorOrder;
  local_8c = true;
  puStack_b0 = local_b8;
  local_a8 = local_b8;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_f8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,0);
  if ((local_f8.view_ == (view_pointer)0x0) ||
     ((size_t *)((local_f8.view_)->geometry_).size_ <= local_f8.index_)) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
    pcVar7 = std::runtime_error::~runtime_error;
    puVar8 = &std::runtime_error::typeinfo;
LAB_001bf375:
    __cxa_throw(plVar6,puVar8,pcVar7);
  }
  iVar1 = *local_f8.pointer_;
  local_88.view_ = (view_pointer)((ulong)local_88.view_ & 0xffffffff00000000);
  piVar2 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,true,std::allocator<unsigned_long>>
                     ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,(int *)&local_88);
  if (iVar1 != *piVar2) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test failed.");
    pcVar7 = std::logic_error::~logic_error;
    puVar8 = &std::logic_error::typeinfo;
    goto LAB_001bf375;
  }
  if (local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(local_b8,(long)puStack_a0 * 0x18);
  local_58.view_._0_4_ = 0x2a;
  local_c8 = (undefined1  [8])&local_58;
  local_b8 = (size_t *)operator_new(0);
  puStack_a0 = (pointer)0x0;
  local_98 = 1;
  local_90 = LastMajorOrder;
  local_8c = true;
  puStack_b0 = local_b8;
  local_a8 = local_b8;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_f8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,0);
  if ((local_f8.view_ == (view_pointer)0x0) ||
     ((size_t *)((local_f8.view_)->geometry_).size_ <= local_f8.index_)) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
    pcVar7 = std::runtime_error::~runtime_error;
    puVar8 = &std::runtime_error::typeinfo;
LAB_001bf3a7:
    __cxa_throw(plVar6,puVar8,pcVar7);
  }
  iVar1 = *local_f8.pointer_;
  local_88.view_ = (view_pointer)((ulong)local_88.view_ & 0xffffffff00000000);
  piVar2 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,true,std::allocator<unsigned_long>>
                     ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,(int *)&local_88);
  if (iVar1 != *piVar2) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test failed.");
    pcVar7 = std::logic_error::~logic_error;
    puVar8 = &std::logic_error::typeinfo;
    goto LAB_001bf3a7;
  }
  if (local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(local_b8,(long)puStack_a0 * 0x18);
  local_58.view_._0_4_ = 0x2a;
  local_c8 = (undefined1  [8])&local_58;
  local_b8 = (size_t *)operator_new(0);
  puStack_a0 = (pointer)0x0;
  local_98 = 1;
  local_90 = LastMajorOrder;
  local_8c = true;
  puStack_b0 = local_b8;
  local_a8 = local_b8;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_f8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,0);
  if ((local_f8.view_ == (view_pointer)0x0) ||
     ((size_t *)((local_f8.view_)->geometry_).size_ <= local_f8.index_)) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
    pcVar7 = std::runtime_error::~runtime_error;
    puVar8 = &std::runtime_error::typeinfo;
LAB_001bf3d9:
    __cxa_throw(plVar6,puVar8,pcVar7);
  }
  iVar1 = *local_f8.pointer_;
  local_88.view_ = (view_pointer)((ulong)local_88.view_ & 0xffffffff00000000);
  piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>
                     ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,(int *)&local_88)
  ;
  if (iVar1 != *piVar3) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test failed.");
    pcVar7 = std::logic_error::~logic_error;
    puVar8 = &std::logic_error::typeinfo;
    goto LAB_001bf3d9;
  }
  if (local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(local_b8,(long)puStack_a0 * 0x18);
  _Var4._M_current = (unsigned_long *)operator_new(8);
  *_Var4._M_current = 0x18;
  local_c8 = (undefined1  [8])this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)&piStack_c0,_Var4,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var4._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_f8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_f8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,0);
  lVar9 = 0;
  do {
    if ((local_f8.view_ == (view_pointer)0x0) ||
       ((size_t *)((local_f8.view_)->geometry_).size_ <= local_f8.index_)) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
      pcVar7 = std::runtime_error::~runtime_error;
      puVar8 = &std::runtime_error::typeinfo;
LAB_001be931:
      __cxa_throw(plVar6,puVar8,pcVar7);
    }
    if (*local_f8.pointer_ != this->data_[lVar9]) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"test failed.");
      pcVar7 = std::logic_error::~logic_error;
      puVar8 = &std::logic_error::typeinfo;
      goto LAB_001be931;
    }
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_f8);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x18);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_88,(View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,local_98);
  if (local_f8.view_ == (view_pointer)0x0) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
  }
  else {
    if (local_88.view_ == local_f8.view_) {
      if (local_f8.index_ == local_88.index_) {
        pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&local_f8);
        if ((pIVar5->view_ == (view_pointer)0x0) ||
           ((pIVar5->view_->geometry_).size_ <= pIVar5->index_)) {
          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
          goto LAB_001bf41b;
        }
        if (*pIVar5->pointer_ == 0x2e) {
          if (local_88.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_88.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_f8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f8.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_f8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          operator_delete(local_b8,(long)puStack_a0 * 0x18);
          operator_delete(_Var4._M_current,8);
          _Var4._M_current = (unsigned_long *)operator_new(8);
          *_Var4._M_current = 0x18;
          local_c8 = (undefined1  [8])this;
          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Geometry<std::allocator<unsigned_long>> *)&piStack_c0,_Var4,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var4._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                     (allocator_type *)&local_f8);
          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                    (&local_f8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,0);
          lVar9 = 0;
          do {
            if ((local_f8.view_ == (view_pointer)0x0) ||
               ((size_t *)((local_f8.view_)->geometry_).size_ <= local_f8.index_)) {
              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
              pcVar7 = std::runtime_error::~runtime_error;
              puVar8 = &std::runtime_error::typeinfo;
LAB_001be963:
              __cxa_throw(plVar6,puVar8,pcVar7);
            }
            if (*local_f8.pointer_ != this->data_[lVar9]) {
              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar6,"test failed.");
              pcVar7 = std::logic_error::~logic_error;
              puVar8 = &std::logic_error::typeinfo;
              goto LAB_001be963;
            }
            andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_f8);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x18);
          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                    (&local_88,(View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,local_98)
          ;
          if (local_f8.view_ == (view_pointer)0x0) {
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
          }
          else {
            if (local_88.view_ == local_f8.view_) {
              if (local_f8.index_ == local_88.index_) {
                pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                   (&local_f8);
                if ((pIVar5->view_ == (view_pointer)0x0) ||
                   ((pIVar5->view_->geometry_).size_ <= pIVar5->index_)) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                  goto LAB_001bf46b;
                }
                if (*pIVar5->pointer_ == 0x2e) {
                  if (local_88.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_88.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_88.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_88.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_f8.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_f8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                  operator_delete(_Var4._M_current,8);
                  _Var4._M_current = (unsigned_long *)operator_new(8);
                  *_Var4._M_current = 0x18;
                  local_c8 = (undefined1  [8])this;
                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((Geometry<std::allocator<unsigned_long>> *)&piStack_c0,_Var4,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )(_Var4._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                             (allocator_type *)&local_f8);
                  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                            (&local_f8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,
                             0);
                  lVar9 = 0;
                  do {
                    if ((local_f8.view_ == (view_pointer)0x0) ||
                       ((size_t *)((local_f8.view_)->geometry_).size_ <= local_f8.index_)) {
                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.")
                      ;
                      pcVar7 = std::runtime_error::~runtime_error;
                      puVar8 = &std::runtime_error::typeinfo;
LAB_001be995:
                      __cxa_throw(plVar6,puVar8,pcVar7);
                    }
                    if (*local_f8.pointer_ != this->data_[lVar9]) {
                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar6,"test failed.");
                      pcVar7 = std::logic_error::~logic_error;
                      puVar8 = &std::logic_error::typeinfo;
                      goto LAB_001be995;
                    }
                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                              (&local_f8);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 0x18);
                  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
                  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_88,
                             (View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,local_98);
                  if (local_f8.view_ == (view_pointer)0x0) {
                    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                  }
                  else {
                    if (local_88.view_ == local_f8.view_) {
                      if (local_f8.index_ == local_88.index_) {
                        pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                 operator--(&local_f8);
                        if ((pIVar5->view_ == (view_pointer)0x0) ||
                           ((pIVar5->view_->geometry_).size_ <= pIVar5->index_)) {
                          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar6,"Assertion failed.");
                          goto LAB_001bf4bb;
                        }
                        if (*pIVar5->pointer_ == 0x2e) {
                          if (local_88.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_88.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_88.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_88.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (local_f8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_f8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_f8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          operator_delete(local_b8,(long)puStack_a0 * 0x18);
                          operator_delete(_Var4._M_current,8);
                          _Var4._M_current = (unsigned_long *)operator_new(8);
                          *_Var4._M_current = 0x18;
                          local_c8 = (undefined1  [8])this;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)&piStack_c0,_Var4,
                                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      )(_Var4._M_current + 1),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)&local_f8);
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                    (&local_f8,
                                     (View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,0xc
                                    );
                          if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar6,"test failed.");
                            __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                        std::logic_error::~logic_error);
                          }
                          lVar9 = 0xc;
                          do {
                            if ((local_f8.view_ == (view_pointer)0x0) ||
                               ((size_t *)((local_f8.view_)->geometry_).size_ <= local_f8.index_)) {
                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar6,"Assertion failed.");
                              pcVar7 = std::runtime_error::~runtime_error;
                              puVar8 = &std::runtime_error::typeinfo;
LAB_001be9c7:
                              __cxa_throw(plVar6,puVar8,pcVar7);
                            }
                            if (*local_f8.pointer_ != this->data_[lVar9]) {
                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar6,"test failed.");
                              pcVar7 = std::logic_error::~logic_error;
                              puVar8 = &std::logic_error::typeinfo;
                              goto LAB_001be9c7;
                            }
                            andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                                      (&local_f8);
                            lVar9 = lVar9 + 1;
                          } while (lVar9 != 0x18);
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                    (&local_88,
                                     (View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,
                                     local_98);
                          if (local_f8.view_ == (view_pointer)0x0) {
                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar6,"Assertion failed.");
                          }
                          else {
                            if (local_88.view_ == local_f8.view_) {
                              if (local_f8.index_ == local_88.index_) {
                                pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>
                                         ::operator--(&local_f8);
                                if ((pIVar5->view_ == (view_pointer)0x0) ||
                                   ((pIVar5->view_->geometry_).size_ <= pIVar5->index_)) {
                                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar6,"Assertion failed.");
                                  goto LAB_001bf53d;
                                }
                                if (*pIVar5->pointer_ == 0x2e) {
                                  if (local_88.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_88.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  if (local_f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_f8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                  operator_delete(_Var4._M_current,8);
                                  _Var4._M_current = (unsigned_long *)operator_new(8);
                                  *_Var4._M_current = 0x18;
                                  local_c8 = (undefined1  [8])this;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)&piStack_c0,
                                             _Var4,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)&local_f8);
                                  andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_true,_std::allocator<unsigned_long>_> *)
                                                local_c8);
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  Iterator(&local_f8,
                                           (View<int,_true,_std::allocator<unsigned_long>_> *)
                                           local_c8,0xc);
                                  if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar6,"test failed.");
                                    __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                                std::logic_error::~logic_error);
                                  }
                                  lVar9 = 0xc;
                                  do {
                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                       ((size_t *)((local_f8.view_)->geometry_).size_ <=
                                        local_f8.index_)) {
                                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::runtime_error::runtime_error
                                                ((runtime_error *)plVar6,"Assertion failed.");
                                      pcVar7 = std::runtime_error::~runtime_error;
                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001be9f9:
                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                    }
                                    if (*local_f8.pointer_ != this->data_[lVar9]) {
                                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar6,"test failed.");
                                      pcVar7 = std::logic_error::~logic_error;
                                      puVar8 = &std::logic_error::typeinfo;
                                      goto LAB_001be9f9;
                                    }
                                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                    operator++(&local_f8);
                                    lVar9 = lVar9 + 1;
                                  } while (lVar9 != 0x18);
                                  andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_true,_std::allocator<unsigned_long>_> *)
                                                local_c8);
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  Iterator(&local_88,
                                           (View<int,_true,_std::allocator<unsigned_long>_> *)
                                           local_c8,local_98);
                                  if (local_f8.view_ == (view_pointer)0x0) {
                                    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar6,"Assertion failed.");
                                  }
                                  else {
                                    if (local_88.view_ == local_f8.view_) {
                                      if (local_f8.index_ == local_88.index_) {
                                        pIVar5 = andres::
                                                 Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                 ::operator--(&local_f8);
                                        if ((pIVar5->view_ == (view_pointer)0x0) ||
                                           ((pIVar5->view_->geometry_).size_ <= pIVar5->index_)) {
                                          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar6,"Assertion failed.");
                                          goto LAB_001bf5bf;
                                        }
                                        if (*pIVar5->pointer_ == 0x2e) {
                                          if (local_88.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start !=
                                              (pointer)0x0) {
                                            operator_delete(local_88.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                          }
                                          if (local_f8.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start !=
                                              (pointer)0x0) {
                                            operator_delete(local_f8.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                          }
                                          operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                          operator_delete(_Var4._M_current,8);
                                          _Var4._M_current = (unsigned_long *)operator_new(8);
                                          *_Var4._M_current = 0x18;
                                          local_c8 = (undefined1  [8])this;
                                          andres::marray_detail::
                                          Geometry<std::allocator<unsigned_long>>::
                                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Geometry<std::allocator<unsigned_long>> *)
                                                     &piStack_c0,_Var4,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                          ;
                                          andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                          testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                          andres::
                                          Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                          Iterator(&local_f8,
                                                   (View<int,_false,_std::allocator<unsigned_long>_>
                                                    *)local_c8,0xc);
                                          if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar6,"test failed.");
                                            __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          lVar9 = 0xc;
                                          do {
                                            if ((local_f8.view_ == (view_pointer)0x0) ||
                                               ((size_t *)((local_f8.view_)->geometry_).size_ <=
                                                local_f8.index_)) {
                                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar6,"Assertion failed."
                                                        );
                                              pcVar7 = std::runtime_error::~runtime_error;
                                              puVar8 = &std::runtime_error::typeinfo;
LAB_001bea2b:
                                              __cxa_throw(plVar6,puVar8,pcVar7);
                                            }
                                            if (*local_f8.pointer_ != this->data_[lVar9]) {
                                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::logic_error::logic_error(plVar6,"test failed.");
                                              pcVar7 = std::logic_error::~logic_error;
                                              puVar8 = &std::logic_error::typeinfo;
                                              goto LAB_001bea2b;
                                            }
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            operator++(&local_f8);
                                            lVar9 = lVar9 + 1;
                                          } while (lVar9 != 0x18);
                                          andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                          testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                          andres::
                                          Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                          Iterator((
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  *)&local_88,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_c8,local_98);
                                          if (local_f8.view_ == (view_pointer)0x0) {
                                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar6,"Assertion failed.");
                                          }
                                          else {
                                            if (local_88.view_ == local_f8.view_) {
                                              if (local_f8.index_ == local_88.index_) {
                                                pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                   ((pIVar5->view_->geometry_).size_ <=
                                                    pIVar5->index_)) {
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  goto LAB_001bf641;
                                                }
                                                if (*pIVar5->pointer_ == 0x2e) {
                                                  if (local_88.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,8);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var4._M_current = 6;
                                                  _Var4._M_current[1] = 4;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,0);
                                                  lVar9 = 0;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001bea5d:
                                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar9]) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar8 = &std::logic_error::typeinfo;
                                                      goto LAB_001bea5d;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar9 = lVar9 + 1;
                                                  } while (lVar9 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    goto LAB_001bf691;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x10);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var4._M_current = 6;
                                                  _Var4._M_current[1] = 4;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,0);
                                                  lVar9 = 0;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001bea8f:
                                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar9]) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar8 = &std::logic_error::typeinfo;
                                                      goto LAB_001bea8f;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar9 = lVar9 + 1;
                                                  } while (lVar9 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    goto LAB_001bf6e1;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x10);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var4._M_current = 6;
                                                  _Var4._M_current[1] = 4;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0);
                                                  lVar9 = 0;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001beac1:
                                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar9]) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar8 = &std::logic_error::typeinfo;
                                                      goto LAB_001beac1;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar9 = lVar9 + 1;
                                                  } while (lVar9 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  *)&local_88,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    goto LAB_001bf731;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x10);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var4._M_current = 6;
                                                  _Var4._M_current[1] = 4;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,0xc);
                                                  if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  lVar9 = 0xc;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001beaf3:
                                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar9]) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar8 = &std::logic_error::typeinfo;
                                                      goto LAB_001beaf3;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar9 = lVar9 + 1;
                                                  } while (lVar9 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    goto LAB_001bf7b3;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x10);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var4._M_current = 6;
                                                  _Var4._M_current[1] = 4;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,0xc);
                                                  if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  lVar9 = 0xc;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001beb25:
                                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar9]) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar8 = &std::logic_error::typeinfo;
                                                      goto LAB_001beb25;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar9 = lVar9 + 1;
                                                  } while (lVar9 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    goto LAB_001bf835;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x10);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var4._M_current = 6;
                                                  _Var4._M_current[1] = 4;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0xc);
                                                  if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  lVar9 = 0xc;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001beb57:
                                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar9]) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar8 = &std::logic_error::typeinfo;
                                                      goto LAB_001beb57;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar9 = lVar9 + 1;
                                                  } while (lVar9 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  *)&local_88,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    goto LAB_001bf8b7;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x10);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,0);
                                                  lVar9 = 0;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001beb89:
                                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar9]) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar8 = &std::logic_error::typeinfo;
                                                      goto LAB_001beb89;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar9 = lVar9 + 1;
                                                  } while (lVar9 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    goto LAB_001bf907;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,0);
                                                  lVar9 = 0;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001bebbb:
                                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar9]) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar8 = &std::logic_error::typeinfo;
                                                      goto LAB_001bebbb;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar9 = lVar9 + 1;
                                                  } while (lVar9 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    goto LAB_001bf957;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0);
                                                  lVar9 = 0;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001bebed:
                                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar9]) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar8 = &std::logic_error::typeinfo;
                                                      goto LAB_001bebed;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar9 = lVar9 + 1;
                                                  } while (lVar9 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  *)&local_88,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    goto LAB_001bf9a7;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,0xc);
                                                  if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  lVar9 = 0xc;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001bec1f:
                                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar9]) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar8 = &std::logic_error::typeinfo;
                                                      goto LAB_001bec1f;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar9 = lVar9 + 1;
                                                  } while (lVar9 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    goto LAB_001bfa29;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,0xc);
                                                  if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  lVar9 = 0xc;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001bec51:
                                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar9]) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar8 = &std::logic_error::typeinfo;
                                                      goto LAB_001bec51;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar9 = lVar9 + 1;
                                                  } while (lVar9 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_88,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    goto LAB_001bfaab;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0xc);
                                                  if ((size_t *)local_f8.index_ != (size_t *)0xc) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  lVar9 = 0xc;
                                                  do {
                                                    if ((local_f8.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_f8.view_)->geometry_).size_ <=
                                                        local_f8.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001bec83:
                                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                                    }
                                                    if (*local_f8.pointer_ != this->data_[lVar9]) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar8 = &std::logic_error::typeinfo;
                                                      goto LAB_001bec83;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_f8);
                                                  lVar9 = lVar9 + 1;
                                                  } while (lVar9 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  *)&local_88,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_c8,local_98);
                                                  if (local_f8.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_88.view_ == local_f8.view_) {
                                                      if (local_f8.index_ == local_88.index_) {
                                                        pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_f8);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    goto LAB_001bfb2d;
                                                  }
                                                  if (*pIVar5->pointer_ == 0x2e) {
                                                    if (local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var4._M_current = 0x18;
                                                  local_c8 = (undefined1  [8])this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  &piStack_c0,_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f8)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  local_f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_f8.index_ = 0;
                                                  local_f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_f8.view_ = (view_pointer)0x0;
                                                  local_f8.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  *)&local_f8);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  *)&local_88,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_c8,0);
                                                  local_f8.index_ = local_88.index_;
                                                  local_f8.view_ = local_88.view_;
                                                  local_f8.pointer_ = local_88.pointer_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator=(&local_f8.coordinates_,
                                                              &local_88.coordinates_);
                                                  if (local_88.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  local_88.view_ = local_f8.view_;
                                                  local_88.pointer_ = local_f8.pointer_;
                                                  local_88.index_ = local_f8.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_88.coordinates_,
                                                           &local_f8.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_88);
                                                  lVar9 = 0;
                                                  do {
                                                    if ((local_88.view_ == (view_pointer)0x0) ||
                                                       ((size_t *)
                                                        ((local_88.view_)->geometry_).size_ <=
                                                        local_88.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001becb5:
                                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                                    }
                                                    if (*local_88.pointer_ != this->data_[lVar9]) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar8 = &std::logic_error::typeinfo;
                                                      goto LAB_001becb5;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_88);
                                                  lVar9 = lVar9 + 1;
                                                  } while (lVar9 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_58,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,local_98);
                                                  if (local_88.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((view_pointer)
                                                        CONCAT44(local_58.view_._4_4_,
                                                                 local_58.view_._0_4_) ==
                                                        local_88.view_) {
                                                      if (local_88.index_ == local_58.index_) {
                                                        if (local_58.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (size_t *)0x0) {
                                                    operator_delete(local_58.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_58.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_58.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_88);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar8 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    if (*pIVar5->pointer_ == 0x2e) {
                                                      if (local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_88.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_88.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_88.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_b8,(long)puStack_a0 * 0x18);
                                                  operator_delete(_Var4._M_current,8);
                                                  return;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar8 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar8 = &std::logic_error::typeinfo;
                                                  goto LAB_001bfbb7;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bfbb7:
                                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                                  }
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar8 = &std::logic_error::typeinfo;
                                                  goto LAB_001bfb3b;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
LAB_001bfb2d:
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bfb3b:
                                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                                  }
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar8 = &std::logic_error::typeinfo;
                                                  goto LAB_001bfab9;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
LAB_001bfaab:
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bfab9:
                                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                                  }
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar8 = &std::logic_error::typeinfo;
                                                  goto LAB_001bfa37;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
LAB_001bfa29:
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bfa37:
                                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                                  }
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar8 = &std::logic_error::typeinfo;
                                                  goto LAB_001bf9b5;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
LAB_001bf9a7:
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bf9b5:
                                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                                  }
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar8 = &std::logic_error::typeinfo;
                                                  goto LAB_001bf965;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
LAB_001bf957:
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bf965:
                                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                                  }
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar8 = &std::logic_error::typeinfo;
                                                  goto LAB_001bf915;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
LAB_001bf907:
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bf915:
                                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                                  }
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar8 = &std::logic_error::typeinfo;
                                                  goto LAB_001bf8c5;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
LAB_001bf8b7:
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bf8c5:
                                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                                  }
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar8 = &std::logic_error::typeinfo;
                                                  goto LAB_001bf843;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
LAB_001bf835:
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bf843:
                                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                                  }
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar8 = &std::logic_error::typeinfo;
                                                  goto LAB_001bf7c1;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
LAB_001bf7b3:
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bf7c1:
                                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                                  }
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar8 = &std::logic_error::typeinfo;
                                                  goto LAB_001bf73f;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
LAB_001bf731:
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bf73f:
                                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                                  }
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar8 = &std::logic_error::typeinfo;
                                                  goto LAB_001bf6ef;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
LAB_001bf6e1:
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bf6ef:
                                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                                  }
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar8 = &std::logic_error::typeinfo;
                                                  goto LAB_001bf69f;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
LAB_001bf691:
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bf69f:
                                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                                }
                                              }
                                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::logic_error::logic_error(plVar6,"test failed.");
                                              pcVar7 = std::logic_error::~logic_error;
                                              puVar8 = &std::logic_error::typeinfo;
                                              goto LAB_001bf64f;
                                            }
                                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar6,"Assertion failed.");
                                          }
LAB_001bf641:
                                          pcVar7 = std::runtime_error::~runtime_error;
                                          puVar8 = &std::runtime_error::typeinfo;
LAB_001bf64f:
                                          __cxa_throw(plVar6,puVar8,pcVar7);
                                        }
                                      }
                                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar6,"test failed.");
                                      pcVar7 = std::logic_error::~logic_error;
                                      puVar8 = &std::logic_error::typeinfo;
                                      goto LAB_001bf5cd;
                                    }
                                    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar6,"Assertion failed.");
                                  }
LAB_001bf5bf:
                                  pcVar7 = std::runtime_error::~runtime_error;
                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bf5cd:
                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                }
                              }
                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar6,"test failed.");
                              pcVar7 = std::logic_error::~logic_error;
                              puVar8 = &std::logic_error::typeinfo;
                              goto LAB_001bf54b;
                            }
                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar6,"Assertion failed.");
                          }
LAB_001bf53d:
                          pcVar7 = std::runtime_error::~runtime_error;
                          puVar8 = &std::runtime_error::typeinfo;
LAB_001bf54b:
                          __cxa_throw(plVar6,puVar8,pcVar7);
                        }
                      }
                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar6,"test failed.");
                      pcVar7 = std::logic_error::~logic_error;
                      puVar8 = &std::logic_error::typeinfo;
                      goto LAB_001bf4c9;
                    }
                    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                  }
LAB_001bf4bb:
                  pcVar7 = std::runtime_error::~runtime_error;
                  puVar8 = &std::runtime_error::typeinfo;
LAB_001bf4c9:
                  __cxa_throw(plVar6,puVar8,pcVar7);
                }
              }
              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar6,"test failed.");
              pcVar7 = std::logic_error::~logic_error;
              puVar8 = &std::logic_error::typeinfo;
              goto LAB_001bf479;
            }
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
          }
LAB_001bf46b:
          pcVar7 = std::runtime_error::~runtime_error;
          puVar8 = &std::runtime_error::typeinfo;
LAB_001bf479:
          __cxa_throw(plVar6,puVar8,pcVar7);
        }
      }
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"test failed.");
      pcVar7 = std::logic_error::~logic_error;
      puVar8 = &std::logic_error::typeinfo;
      goto LAB_001bf429;
    }
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
  }
LAB_001bf41b:
  pcVar7 = std::runtime_error::~runtime_error;
  puVar8 = &std::runtime_error::typeinfo;
LAB_001bf429:
  __cxa_throw(plVar6,puVar8,pcVar7);
}

Assistant:

void IteratorTest::constructorTest(){
    // empty
    {
        andres::Iterator<int, constTarget> it;
        test(it.index() == 0);
    }
    // view and index
    {
        // scalar
        {
            int scalar = 42;
            andres::View<int, constTarget> v(&scalar);
            andres::Iterator<int, constTarget> it(v, 0);
            
            test(*it == v(0));
        }
        {
            int scalar = 42;
            const andres::View<int, true> v(&scalar);
            andres::Iterator<int, true> it(v, 0);
            
            test(*it == v(0));
        }
        {
            int scalar = 42;
            andres::View<int, false> v(&scalar);
            andres::Iterator<int, true> it(v, 0);
            
            test(*it == v(0));
        }
        // 1D
        {
            // zero offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            // non-zero offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 12);
                
                test(it.index() == 12
                );
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12
                );
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12
                );
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
        }
        // 2D
        {
            // zero offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            // non-zero offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
        }
        // 3D
        {
            // zero offset
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            // non-zero offset
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
        }
    }
    // conversion from mutable to const
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, false> it;
        it = v.begin();
        andres::Iterator<int, true> itc(it);

        for(int i = 0; i < 24; ++i){
            test(*itc == data_[i]);
            ++itc;
        }
        test(itc == v.end());
        test(*(--itc)==46);
    }
}